

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_table_functions.cpp
# Opt level: O2

unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>,_true> __thiscall
duckdb::DefaultTableFunctionGenerator::CreateTableMacroInfo
          (DefaultTableFunctionGenerator *this,DefaultTableMacro *default_macro)

{
  ParserOptions options_p;
  reference pvVar1;
  pointer pSVar2;
  SelectStatement *pSVar3;
  InternalException *this_00;
  MacroFunction *local_90;
  _Head_base<0UL,_duckdb::MacroFunction_*,_false> local_88;
  string local_80;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  Parser parser;
  
  local_60 = 1;
  uStack_58 = 1000;
  local_50 = 0;
  options_p.max_expression_depth = 1000;
  options_p.preserve_identifier_case = true;
  options_p.integer_division = false;
  options_p._2_6_ = 0;
  options_p.extensions = (vector<duckdb::ParserExtension,_true> *)0x0;
  Parser::Parser(&parser,options_p);
  ::std::__cxx11::string::string((string *)&local_80,default_macro->macro,(allocator *)&local_90);
  Parser::ParseQuery(&parser,&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  if ((long)parser.statements.
            super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)parser.statements.
            super_vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 8) {
    pvVar1 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
             ::get<true>(&parser.statements,0);
    pSVar2 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->(pvVar1);
    if (pSVar2->type == SELECT_STATEMENT) {
      pvVar1 = vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
               ::get<true>(&parser.statements,0);
      pSVar2 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
               operator->(pvVar1);
      pSVar3 = SQLStatement::Cast<duckdb::SelectStatement>(pSVar2);
      local_80._M_dataplus._M_p =
           (pointer)(pSVar3->node).
                    super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
                    _M_t.
                    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>
                    .super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pSVar3->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
      make_uniq<duckdb::TableMacroFunction,duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
                ((duckdb *)&local_90,
                 (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *)
                 &local_80);
      local_88._M_head_impl = local_90;
      local_90 = (MacroFunction *)0x0;
      CreateInternalTableMacroInfo
                (this,default_macro,
                 (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>
                  *)&local_88);
      if (local_88._M_head_impl != (MacroFunction *)0x0) {
        (*(local_88._M_head_impl)->_vptr_MacroFunction[1])();
      }
      local_88._M_head_impl = (MacroFunction *)0x0;
      if (local_90 != (MacroFunction *)0x0) {
        (**(code **)(*(long *)local_90 + 8))();
      }
      if ((QueryNode *)local_80._M_dataplus._M_p != (QueryNode *)0x0) {
        (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                 *)&parser);
      return (unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>_>)
             (unique_ptr<duckdb::CreateMacroInfo,_std::default_delete<duckdb::CreateMacroInfo>_>)
             this;
    }
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_80,
             "Expected a single select statement in CreateTableMacroInfo internal",
             (allocator *)&local_90);
  InternalException::InternalException(this_00,&local_80);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CreateMacroInfo>
DefaultTableFunctionGenerator::CreateTableMacroInfo(const DefaultTableMacro &default_macro) {
	Parser parser;
	parser.ParseQuery(default_macro.macro);
	if (parser.statements.size() != 1 || parser.statements[0]->type != StatementType::SELECT_STATEMENT) {
		throw InternalException("Expected a single select statement in CreateTableMacroInfo internal");
	}
	auto node = std::move(parser.statements[0]->Cast<SelectStatement>().node);

	auto result = make_uniq<TableMacroFunction>(std::move(node));
	return CreateInternalTableMacroInfo(default_macro, std::move(result));
}